

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_collection_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::TrustStoreCollectionTest::SetUp(TrustStoreCollectionTest *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  char *in_R9;
  string local_300;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2a0;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_260;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__5;
  Message local_238;
  size_type local_230;
  uint local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1f0;
  Message local_1e8;
  allocator<char> local_1d9;
  string local_1d8;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  Message local_d8;
  size_type local_d0;
  uint local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  string local_a8;
  AssertHelper local_88;
  Message local_80 [3];
  allocator<char> local_61;
  string local_60;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  ParsedCertificateList chain;
  TrustStoreCollectionTest *this_local;
  
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            *)&gtest_ar_.message_);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "testdata/verify_certificate_chain_unittest/key-rollover/oldchain.pem",&local_61);
  local_39 = ReadCertChainFromFile(&local_60,(ParsedCertificateList *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator(&local_61);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar2) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_38,
               (AssertionResult *)
               "ReadCertChainFromFile( \"testdata/verify_certificate_chain_unittest/key-rollover/oldchain.pem\", &chain)"
               ,"false","true",in_R9);
    pcVar3 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    ::std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(local_80);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_c4 = 3;
    local_d0 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::size((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       *)&gtest_ar_.message_);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_c0,"3U","chain.size()",&local_c4,&local_d0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                 ,0x21,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_d8);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      puVar1 = &gtest_ar_.message_;
      pvVar4 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)puVar1,0);
      ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=(&this->target_,pvVar4);
      pvVar4 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)puVar1,1);
      ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=(&this->oldintermediate_,pvVar4);
      pvVar4 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)puVar1,2);
      ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=(&this->oldroot_,pvVar4);
      testing::AssertionResult::AssertionResult<std::shared_ptr<bssl::ParsedCertificate_const>>
                ((AssertionResult *)local_f0,&this->target_,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar2) {
        testing::Message::Message(&local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_f0,(AssertionResult *)"target_"
                   ,"false","true",in_R9);
        pcVar3 = (char *)::std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                   ,0x25,pcVar3);
        testing::internal::AssertHelper::operator=(&local_100,&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        ::std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_f8);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        testing::AssertionResult::AssertionResult<std::shared_ptr<bssl::ParsedCertificate_const>>
                  ((AssertionResult *)local_130,&this->oldintermediate_,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar2) {
          testing::Message::Message(&local_138);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_130,
                     (AssertionResult *)"oldintermediate_","false","true",in_R9);
          pcVar3 = (char *)::std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                     ,0x26,pcVar3);
          testing::internal::AssertHelper::operator=(&local_140,&local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          ::std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_138);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          testing::AssertionResult::AssertionResult<std::shared_ptr<bssl::ParsedCertificate_const>>
                    ((AssertionResult *)local_170,&this->oldroot_,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
          if (!bVar2) {
            testing::Message::Message(&local_178);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__4.message_,(internal *)local_170,
                       (AssertionResult *)"oldroot_","false","true",in_R9);
            pcVar3 = (char *)::std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                       ,0x27,pcVar3);
            testing::internal::AssertHelper::operator=(&local_180,&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_180);
            ::std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_178);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,
                       "testdata/verify_certificate_chain_unittest/key-rollover/longrolloverchain.pem"
                       ,&local_1d9);
            local_1b1 = ReadCertChainFromFile
                                  (&local_1d8,(ParsedCertificateList *)&gtest_ar_.message_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
            ::std::__cxx11::string::~string((string *)&local_1d8);
            ::std::allocator<char>::~allocator(&local_1d9);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
            if (!bVar2) {
              testing::Message::Message(&local_1e8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1.message_,(internal *)local_1b0,
                         (AssertionResult *)
                         "ReadCertChainFromFile(\"testdata/verify_certificate_chain_unittest/\" \"key-rollover/longrolloverchain.pem\", &chain)"
                         ,"false","true",in_R9);
              pcVar3 = (char *)::std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                         ,0x2c,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
              testing::internal::AssertHelper::~AssertHelper(&local_1f0);
              ::std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_1e8);
            }
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
            if (gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_224 = 5;
              local_230 = ::std::
                          vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                          ::size((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                  *)&gtest_ar_.message_);
              testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                        ((EqHelper *)local_220,"5U","chain.size()",&local_224,&local_230);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
              if (!bVar2) {
                testing::Message::Message(&local_238);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                           ,0x2e,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__5.message_,&local_238);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__5.message_);
                testing::Message::~Message(&local_238);
              }
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
              if (gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                puVar1 = &gtest_ar_.message_;
                pvVar4 = ::std::
                         vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                         ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                       *)puVar1,1);
                ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=
                          (&this->newintermediate_,pvVar4);
                pvVar4 = ::std::
                         vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                         ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                       *)puVar1,2);
                ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=(&this->newroot_,pvVar4);
                pvVar4 = ::std::
                         vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                         ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                       *)puVar1,3);
                ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=
                          (&this->newrootrollover_,pvVar4);
                testing::AssertionResult::
                AssertionResult<std::shared_ptr<bssl::ParsedCertificate_const>>
                          ((AssertionResult *)local_250,&this->newintermediate_,(type *)0x0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_250);
                if (!bVar2) {
                  testing::Message::Message(&local_258);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__6.message_,(internal *)local_250,
                             (AssertionResult *)"newintermediate_","false","true",in_R9);
                  pcVar3 = (char *)::std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_260,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                             ,0x32,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_260,&local_258);
                  testing::internal::AssertHelper::~AssertHelper(&local_260);
                  ::std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                  testing::Message::~Message(&local_258);
                }
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
                if (gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  testing::AssertionResult::
                  AssertionResult<std::shared_ptr<bssl::ParsedCertificate_const>>
                            ((AssertionResult *)local_290,&this->newroot_,(type *)0x0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_290);
                  if (!bVar2) {
                    testing::Message::Message(&local_298);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__7.message_,(internal *)local_290,
                               (AssertionResult *)"newroot_","false","true",in_R9);
                    pcVar3 = (char *)::std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                               ,0x33,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
                    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
                    ::std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                    testing::Message::~Message(&local_298);
                  }
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
                  if (gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    testing::AssertionResult::
                    AssertionResult<std::shared_ptr<bssl::ParsedCertificate_const>>
                              ((AssertionResult *)local_2d0,&this->newrootrollover_,(type *)0x0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2d0);
                    if (!bVar2) {
                      testing::Message::Message(&local_2d8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_300,(internal *)local_2d0,
                                 (AssertionResult *)"newrootrollover_","false","true",in_R9);
                      pcVar3 = (char *)::std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_2e0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_collection_unittest.cc"
                                 ,0x34,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
                      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
                      ::std::__cxx11::string::~string((string *)&local_300);
                      testing::Message::~Message(&local_2d8);
                    }
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
                    if (gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             *)&gtest_ar_.message_);
  return;
}

Assistant:

void SetUp() override {
    ParsedCertificateList chain;
    ASSERT_TRUE(ReadCertChainFromFile(
        "testdata/verify_certificate_chain_unittest/key-rollover/oldchain.pem",
        &chain));

    ASSERT_EQ(3U, chain.size());
    target_ = chain[0];
    oldintermediate_ = chain[1];
    oldroot_ = chain[2];
    ASSERT_TRUE(target_);
    ASSERT_TRUE(oldintermediate_);
    ASSERT_TRUE(oldroot_);

    ASSERT_TRUE(
        ReadCertChainFromFile("testdata/verify_certificate_chain_unittest/"
                              "key-rollover/longrolloverchain.pem",
                              &chain));

    ASSERT_EQ(5U, chain.size());
    newintermediate_ = chain[1];
    newroot_ = chain[2];
    newrootrollover_ = chain[3];
    ASSERT_TRUE(newintermediate_);
    ASSERT_TRUE(newroot_);
    ASSERT_TRUE(newrootrollover_);
  }